

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

bool rapidxml::internal::compare<char>
               (char *p1,size_t size1,char *p2,size_t size2,bool case_sensitive)

{
  byte *pbVar1;
  bool bVar2;
  
  if (size1 == size2) {
    pbVar1 = (byte *)(p1 + size1);
    if (case_sensitive) {
      for (; (bVar2 = pbVar1 <= p1, !bVar2 && (*p1 == *p2)); p1 = (char *)((byte *)p1 + 1)) {
        p2 = (char *)((byte *)p2 + 1);
      }
    }
    else {
      while ((bVar2 = pbVar1 <= p1, !bVar2 &&
             (lookup_tables<0>::lookup_upcase[(byte)*p1] ==
              lookup_tables<0>::lookup_upcase[(byte)*p2]))) {
        p1 = (char *)((byte *)p1 + 1);
        p2 = (char *)((byte *)p2 + 1);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool compare(const Ch *p1, std::size_t size1, const Ch *p2, std::size_t size2, bool case_sensitive)
        {
            if (size1 != size2)
                return false;
            if (case_sensitive)
            {
                for (const Ch *end = p1 + size1; p1 < end; ++p1, ++p2)
                    if (*p1 != *p2)
                        return false;
            }
            else
            {
                for (const Ch *end = p1 + size1; p1 < end; ++p1, ++p2)
                    if (lookup_tables<0>::lookup_upcase[static_cast<unsigned char>(*p1)] != lookup_tables<0>::lookup_upcase[static_cast<unsigned char>(*p2)])
                        return false;
            }
            return true;
        }